

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

UINT8 __thiscall DROPlayer::SeekToTick(DROPlayer *this,UINT32 tick)

{
  uint uVar1;
  UINT32 UVar2;
  
  this->_playState = this->_playState | 8;
  uVar1 = this->_playTick;
  if (uVar1 <= tick && tick - uVar1 != 0) {
    ParseFile(this,tick - uVar1);
    uVar1 = this->_playTick;
  }
  UVar2 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x15])(this,(ulong)uVar1);
  this->_playSmpl = UVar2;
  this->_playState = this->_playState & 0xf7;
  return '\0';
}

Assistant:

UINT8 DROPlayer::SeekToTick(UINT32 tick)
{
	_playState |= PLAYSTATE_SEEK;
	if (tick > _playTick)
		ParseFile(tick - _playTick);
	_playSmpl = Tick2Sample(_playTick);
	_playState &= ~PLAYSTATE_SEEK;
	return 0x00;
}